

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_recv(nng_socket s,void *buf,size_t *szp,int flags)

{
  ulong uVar1;
  size_t *__dest;
  void *__src;
  size_t sVar2;
  size_t local_58;
  nng_msg *pnStack_30;
  int rv;
  nng_msg *msg;
  size_t *psStack_20;
  int flags_local;
  size_t *szp_local;
  void *buf_local;
  nng_socket s_local;
  
  msg._4_4_ = flags;
  psStack_20 = szp;
  szp_local = (size_t *)buf;
  buf_local._0_4_ = s.id;
  buf_local._4_4_ = nng_recvmsg(s,&stack0xffffffffffffffd0,flags);
  __dest = szp_local;
  if (buf_local._4_4_ == 0) {
    __src = nng_msg_body(pnStack_30);
    uVar1 = *psStack_20;
    sVar2 = nng_msg_len(pnStack_30);
    if (sVar2 < uVar1) {
      local_58 = nng_msg_len(pnStack_30);
    }
    else {
      local_58 = *psStack_20;
    }
    memcpy(__dest,__src,local_58);
    sVar2 = nng_msg_len(pnStack_30);
    *psStack_20 = sVar2;
    nni_msg_free(pnStack_30);
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int
nng_recv(nng_socket s, void *buf, size_t *szp, int flags)
{
	nng_msg *msg;
	int      rv;

	// Note that while it would be nice to make this a zero copy operation,
	// its not normally possible if a size was specified.
	if ((rv = nng_recvmsg(s, &msg, flags)) != 0) {
		return (rv);
	}
	memcpy(buf, nng_msg_body(msg),
	    *szp > nng_msg_len(msg) ? nng_msg_len(msg) : *szp);
	*szp = nng_msg_len(msg);
	nni_msg_free(msg);
	return (0);
}